

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::writeReport(CLIntercept *this,ostream *os)

{
  long lVar1;
  long lVar2;
  pointer pbVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  iterator __end2;
  __node_base *p_Var10;
  __node_base *p_Var11;
  ulong uVar12;
  pointer pbVar13;
  _Hash_node_base *p_Var14;
  iterator __begin2;
  _Base_ptr p_Var15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  cl_device_id device;
  
  if ((this->m_Config).FinishAfterEnqueue == true) {
    poVar4 = std::operator<<(os,"*** WARNING *** FinishAfterEnqueue Enabled!");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  if ((this->m_Config).FlushAfterEnqueue == true) {
    poVar4 = std::operator<<(os,"*** WARNING *** FlushAfterEnqueue Enabled!");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  if ((this->m_Config).NullEnqueue == true) {
    poVar4 = std::operator<<(os,"*** WARNING *** NullEnqueue Enabled!");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  poVar4 = std::operator<<(os,"Total Enqueues: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  if ((this->m_Config).LeakChecking == true) {
    poVar4 = std::endl<char,std::char_traits<char>>(os);
    poVar4 = std::operator<<(poVar4,"Leak Checking:");
    std::endl<char,std::char_traits<char>>(poVar4);
    CObjectTracker::writeReport(&this->m_ObjectTracker,os);
  }
  if ((this->m_LongKernelNameMap)._M_h._M_element_count != 0) {
    poVar4 = std::endl<char,std::char_traits<char>>(os);
    poVar4 = std::operator<<(poVar4,"Kernel name mapping:");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::endl<char,std::char_traits<char>>(os);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 10;
    poVar4 = std::operator<<(poVar4,"Short Name");
    poVar4 = std::operator<<(poVar4,", ");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 1;
    poVar4 = std::operator<<(poVar4,"Long Name");
    std::endl<char,std::char_traits<char>>(poVar4);
    p_Var10 = &(this->m_LongKernelNameMap)._M_h._M_before_begin;
    while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
      lVar1 = *(long *)os;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 0x10) = 10;
      poVar4 = std::operator<<(os,(string *)(p_Var10 + 5));
      poVar4 = std::operator<<(poVar4,", ");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 1;
      poVar4 = std::operator<<(poVar4,(string *)(p_Var10 + 1));
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  if (((this->m_Config).HostPerformanceTiming == true) &&
     ((this->m_HostTimingStatsMap)._M_h._M_element_count != 0)) {
    poVar4 = std::endl<char,std::char_traits<char>>(os);
    poVar4 = std::operator<<(poVar4,"Host Performance Timing Results:");
    std::endl<char,std::char_traits<char>>(poVar4);
    keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&keys,(this->m_HostTimingStatsMap)._M_h._M_element_count);
    p_Var11 = &(this->m_HostTimingStatsMap)._M_h._M_before_begin;
    uVar12 = 0;
    p_Var14 = (_Hash_node_base *)0x20;
    while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
      if (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var11 + 2))->_M_max_load_factor !=
          (_Hash_node_base *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&keys,(value_type *)(p_Var11 + 1));
        uVar12 = (long)&(p_Var11[8]._M_nxt)->_M_nxt + uVar12;
        if (p_Var14 < *(_Hash_node_base **)
                       &((_Prime_rehash_policy *)(p_Var11 + 2))->_M_max_load_factor) {
          p_Var14 = *(_Hash_node_base **)
                     &((_Prime_rehash_policy *)(p_Var11 + 2))->_M_max_load_factor;
        }
      }
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    poVar4 = std::endl<char,std::char_traits<char>>(os);
    poVar4 = std::operator<<(poVar4,"Total Time (ns): ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::endl<char,std::char_traits<char>>(os);
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(long *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = (long)(int)p_Var14;
    poVar4 = std::operator<<(poVar4,"Function Name");
    poVar4 = std::operator<<(poVar4,", ");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 6;
    poVar4 = std::operator<<(poVar4,"Calls");
    poVar4 = std::operator<<(poVar4,", ");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
    poVar4 = std::operator<<(poVar4,"Time (ns)");
    poVar4 = std::operator<<(poVar4,", ");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
    poVar4 = std::operator<<(poVar4,"Time (%)");
    poVar4 = std::operator<<(poVar4,", ");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
    poVar4 = std::operator<<(poVar4,"Average (ns)");
    poVar4 = std::operator<<(poVar4,", ");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
    poVar4 = std::operator<<(poVar4,"Min (ns)");
    poVar4 = std::operator<<(poVar4,", ");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
    poVar4 = std::operator<<(poVar4,"Max (ns)");
    std::endl<char,std::char_traits<char>>(poVar4);
    pbVar3 = keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar13 = keys.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar3;
        pbVar13 = pbVar13 + 1) {
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SHostTimingStats>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)&this->m_HostTimingStatsMap,pbVar13);
      lVar1 = *(long *)os;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(os + *(long *)(lVar1 + -0x18) + 0x10) = (long)(int)p_Var14;
      poVar4 = std::operator<<(os,(string *)pbVar13);
      poVar4 = std::operator<<(poVar4,", ");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 6;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,", ");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,", ");
      lVar1 = *(long *)poVar4;
      *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 7;
      *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) =
           *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 2;
      poVar4 = (ostream *)
               std::ostream::operator<<(poVar4,((float)pmVar5->TotalNS * 100.0) / (float)uVar12);
      poVar4 = std::operator<<(poVar4,"%, ");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,", ");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,", ");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&keys);
  }
  if (((this->m_Config).DevicePerformanceTiming == true) &&
     ((this->m_DeviceTimingStatsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    p_Var8 = (this->m_DeviceTimingStatsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var8 !=
           &(this->m_DeviceTimingStatsMap)._M_t._M_impl.super__Rb_tree_header) {
      device = *(cl_device_id *)(p_Var8 + 1);
      pmVar6 = std::
               map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
               ::operator[](&this->m_DeviceInfoMap,&device);
      poVar4 = std::endl<char,std::char_traits<char>>(os);
      poVar4 = std::operator<<(poVar4,"Device Performance Timing Results for ");
      poVar4 = std::operator<<(poVar4,(string *)&pmVar6->NameForReport);
      poVar4 = std::operator<<(poVar4,":");
      std::endl<char,std::char_traits<char>>(poVar4);
      keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&keys,*(size_type *)(p_Var8 + 2));
      p_Var9 = (_Base_ptr)&p_Var8[1]._M_right;
      uVar12 = 0;
      p_Var15 = (_Base_ptr)0x20;
      while (p_Var9 = *(_Base_ptr *)p_Var9, p_Var9 != (_Base_ptr)0x0) {
        if (p_Var9->_M_left != (_Base_ptr)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&keys,(value_type *)&p_Var9->_M_parent);
          uVar12 = uVar12 + *(long *)(p_Var9 + 2);
          if (p_Var15 < p_Var9->_M_left) {
            p_Var15 = p_Var9->_M_left;
          }
        }
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (keys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 keys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      poVar4 = std::endl<char,std::char_traits<char>>(os);
      poVar4 = std::operator<<(poVar4,"Total Time (ns): ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::endl<char,std::char_traits<char>>(os);
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(long *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = (long)(int)p_Var15;
      poVar4 = std::operator<<(poVar4,"Function Name");
      poVar4 = std::operator<<(poVar4,", ");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 6;
      poVar4 = std::operator<<(poVar4,"Calls");
      poVar4 = std::operator<<(poVar4,", ");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
      poVar4 = std::operator<<(poVar4,"Time (ns)");
      poVar4 = std::operator<<(poVar4,", ");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
      poVar4 = std::operator<<(poVar4,"Time (%)");
      poVar4 = std::operator<<(poVar4,", ");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
      poVar4 = std::operator<<(poVar4,"Average (ns)");
      poVar4 = std::operator<<(poVar4,", ");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
      poVar4 = std::operator<<(poVar4,"Min (ns)");
      poVar4 = std::operator<<(poVar4,", ");
      lVar1 = *(long *)poVar4;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
      poVar4 = std::operator<<(poVar4,"Max (ns)");
      std::endl<char,std::char_traits<char>>(poVar4);
      pbVar3 = keys.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar13 = keys.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar3;
          pbVar13 = pbVar13 + 1) {
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&p_Var8[1]._M_parent,pbVar13);
        lVar1 = *(long *)os;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(long *)(os + *(long *)(lVar1 + -0x18) + 0x10) = (long)(int)p_Var15;
        poVar4 = std::operator<<(os,(string *)pbVar13);
        poVar4 = std::operator<<(poVar4,", ");
        lVar1 = *(long *)poVar4;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 6;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,", ");
        lVar1 = *(long *)poVar4;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,", ");
        lVar1 = *(long *)poVar4;
        *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 7;
        *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
        *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 2;
        poVar4 = (ostream *)
                 std::ostream::operator<<(poVar4,((float)pmVar7->TotalNS * 100.0) / (float)uVar12);
        poVar4 = std::operator<<(poVar4,"%, ");
        lVar1 = *(long *)poVar4;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,", ");
        lVar1 = *(long *)poVar4;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,", ");
        lVar1 = *(long *)poVar4;
        lVar2 = *(long *)(lVar1 + -0x18);
        *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xd;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&keys);
    }
  }
  if ((this->m_Config).DevicePerfCounterEventBasedSampling == true) {
    reportMDAPICounters(this,os);
  }
  return;
}

Assistant:

void CLIntercept::writeReport(
    std::ostream& os )
{
    if( config().FinishAfterEnqueue )
    {
        os << "*** WARNING *** FinishAfterEnqueue Enabled!" << std::endl << std::endl;
    }
    if( config().FlushAfterEnqueue )
    {
        os << "*** WARNING *** FlushAfterEnqueue Enabled!" << std::endl << std::endl;
    }
    if( config().NullEnqueue )
    {
        os << "*** WARNING *** NullEnqueue Enabled!" << std::endl << std::endl;
    }

    os << "Total Enqueues: " << m_EnqueueCounter.load(std::memory_order_relaxed) << std::endl << std::endl;

    if( config().LeakChecking )
    {
        os << std::endl << "Leak Checking:" << std::endl;
        m_ObjectTracker.writeReport( os );
    }

    if( !m_LongKernelNameMap.empty() )
    {
        os << std::endl << "Kernel name mapping:" << std::endl;

        os << std::endl
            << std::right << std::setw(10) << "Short Name" << ", "
            << std::right << std::setw(1) << "Long Name" << std::endl;

        CLongKernelNameMap::const_iterator i = m_LongKernelNameMap.begin();
        while( i != m_LongKernelNameMap.end() )
        {
            os << std::right << std::setw(10) << i->second << ", "
                << std::right << std::setw(1) << i->first << std::endl;

            ++i;
        }
    }

    if( config().HostPerformanceTiming &&
        !m_HostTimingStatsMap.empty() )
    {
        os << std::endl << "Host Performance Timing Results:" << std::endl;

        std::vector<std::string> keys;
        keys.reserve(m_HostTimingStatsMap.size());

        uint64_t    totalTotalNS = 0;
        size_t      longestName = 32;

        CHostTimingStatsMap::const_iterator i = m_HostTimingStatsMap.begin();
        while( i != m_HostTimingStatsMap.end() )
        {
            const std::string& name = (*i).first;
            const SHostTimingStats& hostTimingStats = (*i).second;

            if( !name.empty() )
            {
                keys.push_back(name);
                totalTotalNS += hostTimingStats.TotalNS;
                longestName = std::max< size_t >( name.length(), longestName );
            }

            ++i;
        }

        std::sort(keys.begin(), keys.end());

        os << std::endl << "Total Time (ns): " << totalTotalNS << std::endl;

        os << std::endl
            << std::right << std::setw(longestName) << "Function Name" << ", "
            << std::right << std::setw( 6) << "Calls" << ", "
            << std::right << std::setw(13) << "Time (ns)" << ", "
            << std::right << std::setw( 8) << "Time (%)" << ", "
            << std::right << std::setw(13) << "Average (ns)" << ", "
            << std::right << std::setw(13) << "Min (ns)" << ", "
            << std::right << std::setw(13) << "Max (ns)" << std::endl;

        for( const auto& name : keys )
        {
            const SHostTimingStats& hostTimingStats = m_HostTimingStatsMap.at(name);

            os << std::right << std::setw(longestName) << name << ", "
                << std::right << std::setw( 6) << hostTimingStats.NumberOfCalls << ", "
                << std::right << std::setw(13) << hostTimingStats.TotalNS << ", "
                << std::right << std::setw( 7) << std::fixed << std::setprecision(2) << hostTimingStats.TotalNS * 100.0f / totalTotalNS << "%, "
                << std::right << std::setw(13) << hostTimingStats.TotalNS / hostTimingStats.NumberOfCalls << ", "
                << std::right << std::setw(13) << hostTimingStats.MinNS << ", "
                << std::right << std::setw(13) << hostTimingStats.MaxNS << std::endl;
        }
    }

    if( config().DevicePerformanceTiming &&
        !m_DeviceTimingStatsMap.empty() )
    {
        CDeviceDeviceTimingStatsMap::const_iterator id = m_DeviceTimingStatsMap.begin();
        while( id != m_DeviceTimingStatsMap.end() )
        {
            const cl_device_id  device = (*id).first;
            const CDeviceTimingStatsMap& dtsm = (*id).second;

            const SDeviceInfo&  deviceInfo = m_DeviceInfoMap[device];

            os << std::endl << "Device Performance Timing Results for " << deviceInfo.NameForReport << ":" << std::endl;

            std::vector<std::string> keys;
            keys.reserve(dtsm.size());

            cl_ulong    totalTotalNS = 0;
            size_t      longestName = 32;

            CDeviceTimingStatsMap::const_iterator i = dtsm.begin();
            while( i != dtsm.end() )
            {
                const std::string& name = (*i).first;
                const SDeviceTimingStats& deviceTimingStats = (*i).second;

                if( !name.empty() )
                {
                    keys.push_back(name);
                    totalTotalNS += deviceTimingStats.TotalNS;
                    longestName = std::max< size_t >( name.length(), longestName );
                }

                ++i;
            }

            std::sort(keys.begin(), keys.end());

            os << std::endl << "Total Time (ns): " << totalTotalNS << std::endl;

            os << std::endl
                << std::right << std::setw(longestName) << "Function Name" << ", "
                << std::right << std::setw( 6) << "Calls" << ", "
                << std::right << std::setw(13) << "Time (ns)" << ", "
                << std::right << std::setw( 8) << "Time (%)" << ", "
                << std::right << std::setw(13) << "Average (ns)" << ", "
                << std::right << std::setw(13) << "Min (ns)" << ", "
                << std::right << std::setw(13) << "Max (ns)" << std::endl;

            for( const auto& name : keys )
            {
                const SDeviceTimingStats& deviceTimingStats = dtsm.at(name);

                os << std::right << std::setw(longestName) << name << ", "
                    << std::right << std::setw( 6) << deviceTimingStats.NumberOfCalls << ", "
                    << std::right << std::setw(13) << deviceTimingStats.TotalNS << ", "
                    << std::right << std::setw( 7) << std::fixed << std::setprecision(2) << deviceTimingStats.TotalNS * 100.0f / totalTotalNS << "%, "
                    << std::right << std::setw(13) << deviceTimingStats.TotalNS / deviceTimingStats.NumberOfCalls << ", "
                    << std::right << std::setw(13) << deviceTimingStats.MinNS << ", "
                    << std::right << std::setw(13) << deviceTimingStats.MaxNS << std::endl;
            }

            ++id;
        }
    }

#if defined(USE_MDAPI)
    if( config().DevicePerfCounterEventBasedSampling )
    {
        reportMDAPICounters( os );
    }
#endif
}